

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int GetLatestDataHokuyox(HOKUYO *pHokuyo,double *pDistances,double *pAngles)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iStack_203c;
  char acStack_2038 [8200];
  
  memset(acStack_2038,0,0x2000);
  iStack_203c = 0;
  iVar1 = GetLatestHokuyoMessageHokuyo(pHokuyo,acStack_2038,0x2000,&iStack_203c);
  if (iVar1 == 0) {
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < iStack_203c; lVar3 = lVar3 + 3) {
      pAngles[lVar2] =
           ((double)(((pHokuyo->SlitDivision / 2 + pHokuyo->StartingStep) - pHokuyo->FrontStep) +
                    (int)lVar2) * pHokuyo->StepAngleSize * 3.141592653589793) / 180.0 +
           -3.141592653589793;
      iVar1 = CharacterDecodingHokuyo(acStack_2038 + lVar3,3);
      pDistances[lVar2] = (double)iVar1 / 1000.0;
      lVar2 = lVar2 + 1;
    }
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

HARDWAREX_API int GetLatestDataHokuyox(HOKUYO* pHokuyo, double* pDistances, double* pAngles)
{
	return GetLatestDataHokuyo(pHokuyo, pDistances, pAngles);
}